

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_get_compression_type(fitsfile *fptr,int *ctype,int *status)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = fptr->Fptr->request_compress_type;
  *ctype = iVar1;
  uVar2 = iVar1 + 1;
  if ((0x34 < uVar2) || ((0x10040100c01003U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) {
    ffpmsg("unknown compression algorithm (fits_get_compression_type)");
    *status = 0x19d;
  }
  return *status;
}

Assistant:

int fits_get_compression_type(fitsfile *fptr,  /* I - FITS file pointer     */
       int *ctype,   /* image compression type code;                        */
                     /* allowed values:                                     */
		     /* RICE_1, GZIP_1, GZIP_2, PLIO_1, HCOMPRESS_1, BZIP2_1 */
       int *status)  /* IO - error status                                   */
{
/*
   This routine returns the image compression algorithm that should be
   used when writing a FITS image.  The image is divided into tiles, and
   each tile is compressed and stored in a row of at variable length binary
   table column.
*/
    *ctype = (fptr->Fptr)->request_compress_type;

    if (*ctype != RICE_1 && 
        *ctype != GZIP_1 && 
        *ctype != GZIP_2 && 
        *ctype != PLIO_1 && 
        *ctype != HCOMPRESS_1 && 
        *ctype != BZIP2_1 && 
        *ctype != NOCOMPRESS &&
	*ctype != 0   ) 

    {
	ffpmsg("unknown compression algorithm (fits_get_compression_type)");
	*status = DATA_COMPRESSION_ERR; 
    }
 
    return(*status);
}